

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

uint8_t argumentList(void)

{
  _Bool _Var1;
  char cVar2;
  uint8_t uVar3;
  
  if (parser.current.type == TOKEN_RIGHT_PAREN) {
    uVar3 = '\0';
  }
  else {
    cVar2 = '\0';
    do {
      expression();
      if (cVar2 == '\x01') {
        error("Cannot have more than 255 arguments.");
      }
      _Var1 = match(TOKEN_COMMA);
      cVar2 = cVar2 + -1;
    } while (_Var1);
    uVar3 = -cVar2;
  }
  consume(TOKEN_RIGHT_PAREN,"Expect \')\' after arguments.");
  return uVar3;
}

Assistant:

static uint8_t argumentList() {
    uint8_t argCount = 0;
    if (!check(TOKEN_RIGHT_PAREN)) {
        do {
            expression();

            if (argCount == PARAMS_MAX) {
                error("Cannot have more than 255 arguments.");
            }

            argCount++;
        } while (match(TOKEN_COMMA));
    }

    consume(TOKEN_RIGHT_PAREN, "Expect ')' after arguments.");
    return argCount;
}